

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O1

int __thiscall
f8n::prefs::Preferences::GetString
          (Preferences *this,char *key,char *dst,size_t size,char *defaultValue)

{
  string value;
  allocator<char> local_82;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,key,&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,defaultValue,&local_82);
  (*(this->super_IPreferences)._vptr_IPreferences[0xd])(&local_80,this,local_40,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (dst != (char *)0x0) {
    local_78 = std::__cxx11::string::copy((char *)&local_80,(ulong)dst,size - 1);
    dst[local_78] = '\0';
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return (int)local_78 + 1;
}

Assistant:

int Preferences::GetString(const char* key, char* dst, size_t size, const char* defaultValue) {
    std::string value = this->GetString(std::string(key), defaultValue);
    return str::copy(value, dst, size);
}